

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O0

int __thiscall ncnn::Convolution1D_x86_fma::create_pipeline(Convolution1D_x86_fma *this,Option *opt)

{
  ulong uVar1;
  long in_RSI;
  long *in_RDI;
  float *k00;
  int j;
  int i;
  int k;
  int p;
  float *g00;
  int q;
  Mat weight_data_r2;
  int out_elempack;
  int elempack;
  int num_input;
  Mat *m_1;
  Mat *m;
  undefined8 in_stack_fffffffffffffc80;
  size_t in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  int _c;
  undefined8 in_stack_fffffffffffffc98;
  Mat *in_stack_fffffffffffffca0;
  int local_318;
  int local_314;
  undefined8 local_308;
  Allocator *in_stack_fffffffffffffd00;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  undefined8 local_2a8;
  Allocator *in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd6c;
  int in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  Mat *in_stack_fffffffffffffd78;
  undefined4 *local_260;
  int local_258;
  void *local_248;
  int *local_240;
  long local_238;
  long *local_228;
  int local_21c;
  int local_218;
  long local_208;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  undefined1 local_1d5;
  int local_1d4;
  void **local_1d0;
  undefined8 *local_1c8;
  undefined1 local_1bd;
  int local_1bc;
  long *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_190;
  undefined8 *local_180;
  void **local_170;
  int local_15c;
  undefined8 *local_158;
  long local_150;
  undefined4 local_144;
  long local_140;
  undefined4 *local_138;
  undefined4 local_12c;
  int local_128;
  int local_124;
  undefined8 *local_120;
  void *local_100;
  undefined8 *local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  int local_b0;
  undefined4 local_ac;
  void **local_a8;
  undefined8 *local_88;
  undefined8 *local_68;
  
  _c = (int)((ulong)in_stack_fffffffffffffc90 >> 0x20);
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x140) == 0) {
    uVar1 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) /
            (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    local_1f4 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                     (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
    local_1f8 = 1;
    local_1fc = 1;
    if ((*(byte *)(in_RSI + 0x27) & 1) != 0) {
      if (local_1f4 % 8 == 0) {
        local_314 = 8;
      }
      else {
        local_314 = 1;
        if (local_1f4 % 4 == 0) {
          local_314 = 4;
        }
      }
      local_1f8 = local_314;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) {
        local_318 = 8;
      }
      else {
        local_318 = 1;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) {
          local_318 = 4;
        }
      }
      local_1fc = local_318;
    }
    Mat::reshape(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60);
    Mat::create(in_stack_fffffffffffffca0,(int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                (int)in_stack_fffffffffffffc98,_c,in_stack_fffffffffffffc88,
                (int)((ulong)in_stack_fffffffffffffc80 >> 0x20),in_stack_fffffffffffffd00);
    for (local_258 = 0;
        local_258 + local_1fc + -1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_258 = local_1fc + local_258) {
      local_1b8 = in_RDI + 1;
      local_1bc = local_258 / local_1fc;
      local_1b0 = &local_2a8;
      local_124 = *(int *)((long)in_RDI + 0x34);
      local_128 = (int)in_RDI[7];
      local_12c = *(undefined4 *)((long)in_RDI + 0x3c);
      local_138 = (undefined4 *)(*local_1b8 + in_RDI[9] * (long)local_1bc * in_RDI[3]);
      local_140 = in_RDI[3];
      local_144 = (undefined4)in_RDI[4];
      local_150 = in_RDI[5];
      local_120 = &local_2a8;
      local_c8 = (long)local_124 * (long)local_128 * local_140;
      local_1a8 = &local_2a8;
      local_190 = &local_2a8;
      local_cc = 0x10;
      local_1bd = 1;
      local_2a8 = 0;
      local_260 = local_138;
      for (local_2ac = 0; local_2ac + local_1f8 + -1 < local_1f4; local_2ac = local_1f8 + local_2ac)
      {
        for (local_2b0 = 0; local_2b0 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
            local_2b0 = local_2b0 + 1) {
          for (local_2b4 = 0; local_2b4 < local_1f8; local_2b4 = local_2b4 + 1) {
            for (local_2b8 = 0; local_2b8 < local_1fc; local_2b8 = local_2b8 + 1) {
              local_1d4 = local_258 + local_2b8;
              local_1c8 = &local_308;
              local_1d0 = &local_248;
              local_100 = (void *)((long)local_248 + local_208 * local_1d4 * local_238);
              local_e8 = &local_308;
              local_d8 = (long)local_21c * (long)local_218 * local_238;
              local_15c = local_2ac + local_2b4;
              local_158 = &local_308;
              local_180 = &local_308;
              local_dc = 0x10;
              local_1d5 = 1;
              local_308 = 0;
              *local_260 = *(undefined4 *)
                            ((long)local_100 +
                            (long)local_2b0 * 4 + (long)local_21c * (long)local_15c * local_238);
              local_260 = local_260 + 1;
              local_88 = local_180;
            }
          }
        }
      }
      local_68 = local_190;
    }
    local_170 = &local_248;
    if (local_240 != (int *)0x0) {
      local_ac = 0xffffffff;
      LOCK();
      local_b0 = *local_240;
      *local_240 = *local_240 + -1;
      UNLOCK();
      if (local_b0 == 1) {
        local_a8 = local_170;
        if (local_228 == (long *)0x0) {
          if (local_248 != (void *)0x0) {
            free(local_248);
          }
        }
        else {
          (**(code **)(*local_228 + 0x18))(local_228,local_248);
        }
      }
    }
  }
  return 0;
}

Assistant:

int Convolution1D_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}